

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugTextUnformattedWithLocateItem(char *line_begin,char *line_end)

{
  char *text_end;
  ImVec2 IVar1;
  ImVec2 IVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  char *text_end_00;
  float size;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImGuiID id;
  ImGuiID local_7c;
  ImVec2 *local_78;
  ImVec2 *local_70;
  undefined1 local_68 [8];
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 local_58 [16];
  ImVec2 local_48;
  undefined8 uStack_40;
  
  TextUnformatted(line_begin,line_end);
  bVar3 = IsItemHovered(0);
  if ((bVar3) && (line_begin <= line_end + -10)) {
    local_78 = &(GImGui->LastItemData).Rect.Min;
    local_48 = (GImGui->LastItemData).Rect.Min;
    local_70 = &(GImGui->LastItemData).Rect.Max;
    uStack_40 = 0;
    local_58 = ZEXT416((uint)(local_48.y + 0.0));
    text_end_00 = line_begin;
    do {
      local_7c = 0;
      if ((((*text_end_00 == '0') && ((byte)(text_end_00[1] | 0x20U) == 0x78)) &&
          (iVar4 = __isoc99_sscanf(text_end_00 + 2,"%X",&local_7c), iVar4 == 1)) &&
         ((9 < (byte)(text_end_00[10] - 0x30U) &&
          ((uVar5 = (byte)text_end_00[10] - 0x41, 0x25 < uVar5 ||
           ((0x3f0000003fU >> ((ulong)uVar5 & 0x3f) & 1) == 0)))))) {
        size = GImGui->FontSize;
        if (text_end_00 == line_begin) {
          _local_68 = ZEXT416((uint)size) << 0x20;
        }
        else {
          IVar1 = ImFont::CalcTextSizeA
                            (GImGui->Font,size,3.4028235e+38,-1.0,line_begin,text_end_00,
                             (char **)0x0);
          local_68._4_4_ = IVar1.y;
          local_68._0_4_ = (float)(int)(IVar1.x + 0.99999);
          uStack_60 = extraout_XMM0_Dc;
          uStack_5c = extraout_XMM0_Dd;
          size = GImGui->FontSize;
        }
        text_end = text_end_00 + 10;
        IVar2 = ImFont::CalcTextSizeA
                          (GImGui->Font,size,3.4028235e+38,-1.0,text_end_00,text_end,(char **)0x0);
        local_78->x = local_48.x + (float)local_68._0_4_;
        local_78->y = (float)local_58._0_4_;
        IVar1.y = IVar2.y + local_48.y;
        IVar1.x = (float)(int)(IVar2.x + 0.99999) + (float)local_68._0_4_ + local_48.x;
        *local_70 = IVar1;
        bVar3 = IsMouseHoveringRect(local_78,local_70,true);
        text_end_00 = text_end;
        if (bVar3) {
          DebugLocateItemOnHover(local_7c);
        }
      }
      text_end_00 = text_end_00 + 1;
    } while (text_end_00 <= line_end + -10);
  }
  return;
}

Assistant:

void ImGui::DebugTextUnformattedWithLocateItem(const char* line_begin, const char* line_end)
{
    TextUnformatted(line_begin, line_end);
    if (!IsItemHovered())
        return;
    ImGuiContext& g = *GImGui;
    ImRect text_rect = g.LastItemData.Rect;
    for (const char* p = line_begin; p <= line_end - 10; p++)
    {
        ImGuiID id = 0;
        if (p[0] != '0' || (p[1] != 'x' && p[1] != 'X') || sscanf(p + 2, "%X", &id) != 1 || ImCharIsXdigitA(p[10]))
            continue;
        ImVec2 p0 = CalcTextSize(line_begin, p);
        ImVec2 p1 = CalcTextSize(p, p + 10);
        g.LastItemData.Rect = ImRect(text_rect.Min + ImVec2(p0.x, 0.0f), text_rect.Min + ImVec2(p0.x + p1.x, p1.y));
        if (IsMouseHoveringRect(g.LastItemData.Rect.Min, g.LastItemData.Rect.Max, true))
            DebugLocateItemOnHover(id);
        p += 10;
    }
}